

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

FieldDescriptorProto * __thiscall
perfetto::protos::gen::FieldDescriptorProto::operator=
          (FieldDescriptorProto *this,FieldDescriptorProto *param_1)

{
  FieldDescriptorProto_Label FVar1;
  
  ::std::__cxx11::string::operator=((string *)&this->name_,(string *)&param_1->name_);
  FVar1 = param_1->label_;
  this->number_ = param_1->number_;
  this->label_ = FVar1;
  this->type_ = param_1->type_;
  ::std::__cxx11::string::operator=((string *)&this->type_name_,(string *)&param_1->type_name_);
  ::std::__cxx11::string::operator=((string *)&this->extendee_,(string *)&param_1->extendee_);
  ::std::__cxx11::string::operator=
            ((string *)&this->default_value_,(string *)&param_1->default_value_);
  this->oneof_index_ = param_1->oneof_index_;
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool FieldDescriptorProto::operator==(const FieldDescriptorProto& other) const {
  return unknown_fields_ == other.unknown_fields_
   && name_ == other.name_
   && number_ == other.number_
   && label_ == other.label_
   && type_ == other.type_
   && type_name_ == other.type_name_
   && extendee_ == other.extendee_
   && default_value_ == other.default_value_
   && oneof_index_ == other.oneof_index_;
}